

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cs::foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  bool bVar1;
  element_type *peVar2;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end3;
  iterator __begin3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range3;
  any *it;
  const_iterator __end0;
  const_iterator __begin0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range2;
  scope_guard scope;
  _Self *in_stack_fffffffffffffe68;
  process_context *in_stack_fffffffffffffe70;
  any *in_stack_fffffffffffffef0;
  var *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  domain_manager *in_stack_ffffffffffffff60;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_60;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_30;
  
  cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
            (in_stack_fffffffffffffef0);
  bVar1 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::empty
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x5e5abc);
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e5ad4);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e5ae0);
    if ((peVar2->break_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e5af6);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e5b02);
      peVar2->break_block = false;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e5b16);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e5b22);
    if ((peVar2->continue_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e5b38);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e5b44);
      peVar2->continue_block = false;
    }
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffe70,(context_t *)in_stack_fffffffffffffe68);
    local_30 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                         (in_stack_fffffffffffffef0);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe68);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe68);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68),
          bVar1) {
      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator*
                (&local_60);
      process_context::poll_event(in_stack_fffffffffffffe70);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e5bfc);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x5e5c08);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe68);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe68);
      while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe70,
                                     (_Self *)in_stack_fffffffffffffe68), bVar1) {
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator*((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                   *)&stack0xffffffffffffff50);
        statement_base::run((statement_base *)in_stack_fffffffffffffe70);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e5f36);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e5f42);
        if ((peVar2->return_fcall & 1U) != 0) goto LAB_005e602a;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e5f65);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e5f71);
        if ((peVar2->break_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e5f87);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e5f93);
          peVar2->break_block = false;
          goto LAB_005e602a;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e5fb4);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e5fc0);
        if ((peVar2->continue_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e5fd6);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e5fe2);
          peVar2->continue_block = false;
          break;
        }
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                    *)in_stack_fffffffffffffe70);
      }
      scope_guard::clear((scope_guard *)0x5e600c);
      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                ((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
                 in_stack_fffffffffffffe70);
    }
LAB_005e602a:
    scope_guard::~scope_guard((scope_guard *)0x5e6037);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}